

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall Catch::Section::~Section(Section *this)

{
  pointer pcVar1;
  IResultCapture *pIVar2;
  long lVar3;
  undefined1 auVar4 [16];
  timeval t;
  timeval local_28;
  
  if (this->m_sectionIncluded == true) {
    pIVar2 = getResultCapture();
    gettimeofday(&local_28,(__timezone_ptr_t)0x0);
    lVar3 = (local_28.tv_sec * 1000000 + local_28.tv_usec) - (this->m_timer).m_ticks;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    (*pIVar2->_vptr_IResultCapture[4])
              (((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0,pIVar2,
               this,&this->m_assertions);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).lineInfo.file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).lineInfo.file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).description.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded )
            getResultCapture().sectionEnded( m_info, m_assertions, m_timer.getElapsedSeconds() );
    }